

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O1

void __thiscall hello::form(hello *this)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  ostream *poVar7;
  converter<char> *pcVar8;
  undefined8 *puVar9;
  undefined8 uVar10;
  ulong uVar11;
  string descr;
  locale loc;
  form_context context;
  my_form f;
  string local_1d98;
  locale local_1d78 [8];
  ulong *local_1d70;
  long local_1d68;
  ulong local_1d60 [2];
  char *local_1d50;
  long local_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  ios_base local_1c58 [264];
  my_form local_1b50;
  
  my_form::my_form(&local_1b50);
  cppcms::application::request();
  cppcms::http::request::request_method_abi_cxx11_((request *)&local_1d50);
  iVar6 = std::__cxx11::string::compare((char *)&local_1d50);
  if (local_1d50 != (char *)&local_1d40) {
    operator_delete(local_1d50);
  }
  if (iVar6 == 0) {
    cppcms::application::context();
    cppcms::form::load((context *)&local_1b50);
    cVar4 = cppcms::form::validate();
  }
  else {
    cVar4 = '\0';
  }
  cppcms::application::response();
  poVar7 = (ostream *)cppcms::http::response::out();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<html><body>\n",0xd);
  cppcms::application::context();
  cppcms::http::context::locale();
  cVar5 = cppcms::widgets::base_widget::set();
  if (cVar5 != '\0') {
    cppcms::widgets::base_text::value_abi_cxx11_();
    cppcms::application::response();
    poVar7 = (ostream *)cppcms::http::response::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Upper: ",7);
    pcVar8 = std::use_facet<booster::locale::converter<char>>(local_1d78);
    (**(code **)(*(long *)pcVar8 + 0x10))(&local_1d98,pcVar8,1,local_1d50,local_1d50 + local_1d48,0)
    ;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_1d98._M_dataplus._M_p,local_1d98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<br>",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    paVar2 = &local_1d98.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d98._M_dataplus._M_p != paVar2) {
      operator_delete(local_1d98._M_dataplus._M_p);
    }
    cppcms::application::response();
    poVar7 = (ostream *)cppcms::http::response::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Lower: ",7);
    pcVar8 = std::use_facet<booster::locale::converter<char>>(local_1d78);
    (**(code **)(*(long *)pcVar8 + 0x10))(&local_1d98,pcVar8,2,local_1d50,local_1d50 + local_1d48,0)
    ;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_1d98._M_dataplus._M_p,local_1d98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<br>",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d98._M_dataplus._M_p != paVar2) {
      operator_delete(local_1d98._M_dataplus._M_p);
    }
    cppcms::application::response();
    poVar7 = (ostream *)cppcms::http::response::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Title: ",7);
    pcVar8 = std::use_facet<booster::locale::converter<char>>(local_1d78);
    (**(code **)(*(long *)pcVar8 + 0x10))(&local_1d98,pcVar8,4,local_1d50,local_1d50 + local_1d48,0)
    ;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_1d98._M_dataplus._M_p,local_1d98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<br>",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d98._M_dataplus._M_p != paVar2) {
      operator_delete(local_1d98._M_dataplus._M_p);
    }
    cppcms::application::response();
    poVar7 = (ostream *)cppcms::http::response::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Fold Case: ",0xb);
    pcVar8 = std::use_facet<booster::locale::converter<char>>(local_1d78);
    (**(code **)(*(long *)pcVar8 + 0x10))(&local_1d98,pcVar8,3,local_1d50,local_1d50 + local_1d48,0)
    ;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_1d98._M_dataplus._M_p,local_1d98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<br>",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d98._M_dataplus._M_p != paVar2) {
      operator_delete(local_1d98._M_dataplus._M_p);
    }
    if (local_1d50 != (char *)&local_1d40) {
      operator_delete(local_1d50);
    }
  }
  cVar5 = cppcms::widgets::base_widget::set();
  if (cVar5 != '\0') {
    cppcms::widgets::base_text::value_abi_cxx11_();
    cVar5 = cppcms::widgets::base_widget::valid();
    if (cVar5 == '\0') {
      std::ofstream::ofstream(&local_1d50,"test.txt",_S_out);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1d50,local_1d98._M_dataplus._M_p,local_1d98._M_string_length);
      local_1d50 = _VTT;
      *(undefined8 *)((long)&local_1d50 + *(long *)(_VTT + -0x18)) = _post_abi_cxx11_;
      std::filebuf::~filebuf((filebuf *)&local_1d48);
      std::ios_base::~ios_base(local_1c58);
    }
    devide(this,character,&local_1d98,"code");
    devide(this,word,&local_1d98,"word");
    devide(this,sentence,&local_1d98,"sentence");
    devide(this,line,&local_1d98,"line");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d98._M_dataplus._M_p != &local_1d98.field_2) {
      operator_delete(local_1d98._M_dataplus._M_p);
    }
  }
  if (cVar4 != '\0') {
    cppcms::application::response();
    poVar7 = (ostream *)cppcms::http::response::out();
    cppcms::widgets::base_text::value_abi_cxx11_();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1d50,local_1d48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    dVar3 = cppcms::widgets::numeric<double>::value(&local_1b50.age);
    std::ostream::_M_insert<double>(dVar3);
    if (local_1d50 != (char *)&local_1d40) {
      operator_delete(local_1d50);
    }
    cppcms::form::clear();
  }
  cppcms::application::response();
  poVar7 = (ostream *)cppcms::http::response::out();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<form action=\'",0xe);
  cppcms::application::request();
  cppcms::http::request::script_name_abi_cxx11_();
  cppcms::application::request();
  cppcms::http::request::path_info_abi_cxx11_();
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d98._M_dataplus._M_p != &local_1d98.field_2) {
    uVar10 = local_1d98.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_1d68 + local_1d98._M_string_length) {
    uVar11 = 0xf;
    if (local_1d70 != local_1d60) {
      uVar11 = local_1d60[0];
    }
    if (local_1d68 + local_1d98._M_string_length <= uVar11) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1d70,0,(char *)0x0,(ulong)local_1d98._M_dataplus._M_p);
      goto LAB_00118016;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d98,(ulong)local_1d70);
LAB_00118016:
  pcVar1 = (char *)(puVar9 + 2);
  if ((char *)*puVar9 == pcVar1) {
    local_1d40 = *(undefined8 *)pcVar1;
    uStack_1d38 = puVar9[3];
    local_1d50 = (char *)&local_1d40;
  }
  else {
    local_1d40 = *(undefined8 *)pcVar1;
    local_1d50 = (char *)*puVar9;
  }
  local_1d48 = puVar9[1];
  *puVar9 = pcVar1;
  puVar9[1] = 0;
  *pcVar1 = '\0';
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1d50,local_1d48);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"\' method=\'post\' enctype=\'multipart/form-data\' >\n<table>\n",0x38);
  if (local_1d50 != (char *)&local_1d40) {
    operator_delete(local_1d50);
  }
  if (local_1d70 != local_1d60) {
    operator_delete(local_1d70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d98._M_dataplus._M_p != &local_1d98.field_2) {
    operator_delete(local_1d98._M_dataplus._M_p);
  }
  cppcms::application::response();
  uVar10 = cppcms::http::response::out();
  cppcms::form_context::form_context((form_context *)&local_1d50,uVar10,0,0);
  cppcms::form::render((form_context *)&local_1b50);
  cppcms::application::response();
  poVar7 = (ostream *)cppcms::http::response::out();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"</table><input type=\'submit\' value=\'Send\' ></form>\n",0x33);
  cppcms::application::response();
  poVar7 = (ostream *)cppcms::http::response::out();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"</form></body></html>",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  cppcms::form_context::~form_context((form_context *)&local_1d50);
  std::locale::~locale(local_1d78);
  my_form::~my_form(&local_1b50);
  return;
}

Assistant:

void form()
	{
		my_form f;
		bool ok=false;
		if(request().request_method()=="POST") {
			f.load(context());
			if(f.validate()) {
				ok=true;	
			}
		}
		response().out()<<
			"<html><body>\n";
	
		std::locale loc = context().locale();

		if(f.name.set()) {
			using namespace cppcms::locale;
			std::string name = f.name.value();
			response().out() <<"Upper: "<<to_upper(name,loc)<<"<br>"<<std::endl;
			response().out() <<"Lower: "<<to_lower(name,loc)<<"<br>"<<std::endl;
			#ifndef CPPCMS_DISABLE_ICU_LOCALIZATION
			response().out() <<"Title: "<<to_title(name,loc)<<"<br>"<<std::endl;
			response().out() <<"Fold Case: "<<fold_case(name,loc)<<"<br>"<<std::endl;
			#endif

		}
		if(f.description.set()) {
			std::string descr = f.description.value();
			if(!f.description.valid()) {
				std::ofstream tmp("test.txt");
				tmp<<descr;
			}
			#ifndef CPPCMS_DISABLE_ICU_LOCALIZATION
			using namespace cppcms::locale;
			devide(boundary::character,descr,"code");
			devide(boundary::word,descr,"word");
			devide(boundary::sentence,descr,"sentence");
			devide(boundary::line,descr,"line");
			#endif
		}

		if(ok) {
			response().out() << f.name.value() <<" " <<f.age.value();
			f.clear();
		}


		
		response().out()<<
			"<form action='" <<
				request().script_name() + request().path_info()
			<<  "' method='post' enctype='multipart/form-data' >\n"
			"<table>\n";

		cppcms::form_context context(response().out());
		f.render(context);

		response().out()<<"</table><input type='submit' value='Send' ></form>\n";
		response().out()<<"</form></body></html>"<<std::endl;
	}